

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmClassDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprClassDefinition *node)

{
  VmValue *pVVar1;
  ExprClassDefinition *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = anon_unknown.dwarf_aa461::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmClassDefinition(ExpressionContext &ctx, VmModule *module, ExprClassDefinition *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}